

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::setBatchSize(QListView *this,int batchSize)

{
  QListViewPrivate *pQVar1;
  uint in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QListViewPrivate *d;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QListView *)0x876cb9);
  if ((int)in_ESI < 1) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
               (int)((ulong)pQVar1 >> 0x20),in_stack_ffffffffffffffb8);
    QMessageLogger::warning(local_28,"Invalid batchSize (%d)",(ulong)in_ESI);
  }
  else {
    pQVar1->batchSize = in_ESI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::setBatchSize(int batchSize)
{
    Q_D(QListView);
    if (Q_UNLIKELY(batchSize <= 0)) {
        qWarning("Invalid batchSize (%d)", batchSize);
        return;
    }
    d->batchSize = batchSize;
}